

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_true,_true>::enumerate_prefix
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  string *in_RCX;
  string *in_RDX;
  uint in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint32_t label;
  uint32_t child_pos;
  uint32_t base;
  uint32_t value;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_ffffffffffffff50;
  DaTrie<true,_true,_true> *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  string local_88 [32];
  uint local_68;
  uint32_t local_64;
  uint32_t local_60;
  string local_50 [32];
  uint local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = (ulong)in_ESI;
  sVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size
                    ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI);
  if (sVar4 <= uVar3) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x131,
                  "void ddd::DaTrie<true, true, true>::enumerate_prefix(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = true, Prefix = true]"
                 );
  }
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_fixed(pvVar5);
  if (bVar1) {
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
    bVar1 = Bc::is_leaf(pvVar5);
    if (bVar1) {
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
      uVar2 = Bc::value(pvVar5);
      bVar1 = is_terminal_(in_stack_ffffffffffffff58,
                           (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      local_30 = uVar2;
      if (bVar1) {
        local_30 = uVar2 | 0x80000000;
      }
      std::__cxx11::string::string(local_50,in_RDX);
      std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::push_back
                (in_stack_ffffffffffffff50,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      KvPair::~KvPair((KvPair *)0x192dc1);
    }
    else {
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
      local_64 = Bc::base(pvVar5);
      local_60 = local_64;
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_64);
      uVar2 = Bc::check(pvVar5);
      if (uVar2 == in_ESI) {
        enumerate_prefix((DaTrie<true,_true,_true> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         (uint32_t)((ulong)in_RDX >> 0x20),in_RCX,
                         (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
      for (local_68 = 1; local_68 < 0x100; local_68 = local_68 + 1) {
        local_64 = local_60 ^ local_68;
        pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_64);
        uVar2 = Bc::check(pvVar5);
        if (uVar2 == in_ESI) {
          std::operator+(in_RDI,(char)((ulong)in_stack_ffffffffffffff60 >> 0x38));
          enumerate_prefix((DaTrie<true,_true,_true> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                           (uint32_t)((ulong)in_RDX >> 0x20),in_RCX,
                           (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          std::__cxx11::string::~string(local_88);
        }
      }
    }
    return;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x132,
                "void ddd::DaTrie<true, true, true>::enumerate_prefix(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = true, Prefix = true]"
               );
}

Assistant:

void enumerate_prefix(uint32_t node_pos, const std::string& prefix,
                        std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(Prefix);

    if (bc_[node_pos].is_leaf()) {
      auto value = bc_[node_pos].value();
      if (is_terminal_(node_pos)) {
        value |= (1U << 31);
      }
      kvs.push_back(KvPair{prefix, value});
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate_prefix(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate_prefix(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }